

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O1

serial_ptr<char> * __thiscall
BCL::
serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
::operator()(serial_ptr<char> *__return_storage_ptr__,
            serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
            *this,string *string)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char *__p;
  ulong uVar2;
  char *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = string->_M_string_length;
  __return_storage_ptr__->N = uVar2;
  __p = (char *)operator_new__(uVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<char*>(&_Stack_20,__p);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  this_00 = (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  if (string->_M_string_length != 0) {
    uVar2 = 0;
    do {
      __p[uVar2] = (string->_M_dataplus)._M_p[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar2 < string->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

serial_ptr <char> operator()(const std::string &string) const noexcept {
      serial_ptr <char> ptr;
      ptr.N = string.length();
      ptr.ptr = std::shared_ptr <char> (new char[ptr.N]);

      for (int i = 0; i < string.length(); i++) {
        ptr.ptr.get()[i] = string[i];
      }

      return ptr;
    }